

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void smooth_predictor_wxh
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column,int width,
               int height)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  char cVar4;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  uint3 uVar16;
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [11];
  undefined1 auVar39 [14];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [12];
  int x;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  short sVar48;
  short sVar50;
  undefined1 auVar49 [16];
  int iVar51;
  undefined1 auVar52 [16];
  uint uVar53;
  uint uVar64;
  uint uVar68;
  undefined1 auVar54 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar69;
  short sVar70;
  uint uVar71;
  uint uVar80;
  uint uVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar82;
  undefined1 uVar83;
  undefined1 uVar84;
  undefined1 uVar85;
  undefined1 uVar86;
  undefined1 uVar87;
  undefined1 uVar88;
  undefined1 uVar89;
  short sVar90;
  ushort uVar91;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  byte bVar63;
  undefined1 uVar65;
  undefined1 uVar66;
  undefined1 uVar67;
  undefined4 uVar72;
  undefined6 uVar73;
  undefined8 uVar74;
  undefined1 auVar75 [12];
  undefined1 auVar76 [14];
  undefined1 auVar79 [16];
  
  bVar3 = left_column[(long)height + -1];
  auVar49 = pshuflw(ZEXT116(top_row[(long)width + -1]),ZEXT116(top_row[(long)width + -1]),0);
  uVar47 = 0;
  uVar46 = (ulong)(uint)height;
  if (height < 1) {
    uVar46 = uVar47;
  }
  for (; uVar47 != uVar46; uVar47 = uVar47 + 1) {
    bVar63 = *(byte *)((ulong)(uint)height + 0x468b74 + uVar47);
    iVar51 = (ushort)((0x100 - (ushort)bVar63) * (ushort)bVar3) + 0x100;
    uVar16 = CONCAT12(left_column[uVar47],(ushort)bVar63);
    auVar52[3] = 0;
    auVar52._0_3_ = uVar16;
    auVar52._4_3_ = uVar16;
    auVar52[7] = 0;
    auVar52._8_3_ = uVar16;
    auVar52[0xb] = 0;
    auVar52._12_3_ = uVar16;
    auVar52[0xf] = 0;
    for (lVar45 = 0; lVar45 < width; lVar45 = lVar45 + 8) {
      uVar1 = *(ulong *)(top_row + lVar45);
      uVar2 = *(ulong *)((ulong)(uint)width + 0x468b74 + lVar45);
      uVar89 = (undefined1)(uVar2 >> 0x38);
      uVar67 = (undefined1)(uVar1 >> 0x38);
      auVar60._8_6_ = 0;
      auVar60._0_8_ = uVar1;
      auVar60[0xe] = uVar67;
      auVar60[0xf] = uVar89;
      auVar59._14_2_ = auVar60._14_2_;
      auVar59._8_5_ = 0;
      auVar59._0_8_ = uVar1;
      uVar88 = (undefined1)(uVar2 >> 0x30);
      auVar59[0xd] = uVar88;
      uVar66 = (undefined1)(uVar1 >> 0x30);
      auVar58._13_3_ = auVar59._13_3_;
      auVar58._8_4_ = 0;
      auVar58._0_8_ = uVar1;
      auVar58[0xc] = uVar66;
      auVar57._12_4_ = auVar58._12_4_;
      auVar57._8_3_ = 0;
      auVar57._0_8_ = uVar1;
      uVar87 = (undefined1)(uVar2 >> 0x28);
      auVar57[0xb] = uVar87;
      uVar65 = (undefined1)(uVar1 >> 0x28);
      auVar56._11_5_ = auVar57._11_5_;
      auVar56._8_2_ = 0;
      auVar56._0_8_ = uVar1;
      auVar56[10] = uVar65;
      auVar55._10_6_ = auVar56._10_6_;
      auVar55[8] = 0;
      auVar55._0_8_ = uVar1;
      uVar86 = (undefined1)(uVar2 >> 0x20);
      auVar55[9] = uVar86;
      bVar63 = (byte)(uVar1 >> 0x20);
      auVar54._9_7_ = auVar55._9_7_;
      auVar54[8] = bVar63;
      auVar54._0_8_ = uVar1;
      uVar85 = (undefined1)(uVar2 >> 0x18);
      auVar34._1_8_ = auVar54._8_8_;
      auVar34[0] = uVar85;
      auVar34._9_7_ = 0;
      uVar84 = (undefined1)(uVar2 >> 0x10);
      auVar33._10_6_ = 0;
      auVar33._0_10_ = SUB1610(auVar34 << 0x38,6);
      auVar32._11_5_ = 0;
      auVar32._0_11_ = SUB1611(auVar33 << 0x30,5);
      uVar83 = (undefined1)(uVar2 >> 8);
      auVar31._12_4_ = 0;
      auVar31._0_12_ = SUB1612(auVar32 << 0x28,4);
      auVar78._13_3_ = 0;
      auVar78._0_13_ = SUB1613(auVar31 << 0x20,3);
      auVar62._14_2_ = 0;
      auVar62._0_14_ = SUB1614(auVar78 << 0x18,2);
      auVar62 = auVar62 << 0x10;
      auVar17[0xd] = 0;
      auVar17._0_13_ = auVar62._0_13_;
      auVar17[0xe] = uVar85;
      auVar20[0xc] = (char)(uVar1 >> 0x18);
      auVar20._0_12_ = auVar62._0_12_;
      auVar20._13_2_ = auVar17._13_2_;
      auVar22[0xb] = 0;
      auVar22._0_11_ = auVar62._0_11_;
      auVar22._12_3_ = auVar20._12_3_;
      auVar24[10] = uVar84;
      auVar24._0_10_ = auVar62._0_10_;
      auVar24._11_4_ = auVar22._11_4_;
      auVar26[9] = 0;
      auVar26._0_9_ = auVar62._0_9_;
      auVar26._10_5_ = auVar24._10_5_;
      auVar28[8] = (char)(uVar1 >> 0x10);
      auVar28._0_8_ = auVar62._0_8_;
      auVar28._9_6_ = auVar26._9_6_;
      auVar35._7_8_ = 0;
      auVar35._0_7_ = auVar28._8_7_;
      auVar40._1_8_ = SUB158(auVar35 << 0x40,7);
      auVar40[0] = uVar83;
      auVar40._9_6_ = 0;
      auVar41._1_10_ = SUB1510(auVar40 << 0x30,5);
      auVar41[0] = (char)(uVar1 >> 8);
      auVar41._11_4_ = 0;
      auVar77._3_12_ = SUB1512(auVar41 << 0x20,3);
      auVar77[2] = (char)uVar2;
      auVar77[1] = 0;
      auVar77[0] = (byte)uVar1;
      auVar77[0xf] = 0;
      auVar61[1] = 0;
      auVar61[0] = bVar63;
      auVar61[2] = uVar86;
      auVar61[3] = 0;
      auVar61[4] = uVar65;
      auVar61[5] = 0;
      auVar61[6] = uVar87;
      auVar61[7] = 0;
      auVar61[8] = uVar66;
      auVar61[9] = 0;
      auVar61[10] = uVar88;
      auVar61[0xb] = 0;
      auVar61[0xc] = uVar67;
      auVar61[0xd] = 0;
      auVar61[0xe] = uVar89;
      auVar61[0xf] = 0;
      auVar78 = pmaddwd(auVar77,auVar52);
      auVar62 = pmaddwd(auVar61,auVar52);
      auVar18._8_6_ = 0;
      auVar18._0_8_ = uVar2;
      auVar18[0xe] = uVar89;
      auVar21._8_4_ = 0;
      auVar21._0_8_ = uVar2;
      auVar21[0xc] = uVar88;
      auVar21._13_2_ = auVar18._13_2_;
      auVar23._8_4_ = 0;
      auVar23._0_8_ = uVar2;
      auVar23._12_3_ = auVar21._12_3_;
      auVar25._8_2_ = 0;
      auVar25._0_8_ = uVar2;
      auVar25[10] = uVar87;
      auVar25._11_4_ = auVar23._11_4_;
      auVar27._8_2_ = 0;
      auVar27._0_8_ = uVar2;
      auVar27._10_5_ = auVar25._10_5_;
      auVar29[8] = uVar86;
      auVar29._0_8_ = uVar2;
      auVar29._9_6_ = auVar27._9_6_;
      auVar36._7_8_ = 0;
      auVar36._0_7_ = auVar29._8_7_;
      Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),uVar85);
      auVar42._9_6_ = 0;
      auVar42._0_9_ = Var37;
      auVar38._1_10_ = SUB1510(auVar42 << 0x30,5);
      auVar38[0] = uVar84;
      auVar43._11_4_ = 0;
      auVar43._0_11_ = auVar38;
      auVar30[2] = uVar83;
      auVar30._0_2_ = (ushort)uVar2;
      auVar30._3_12_ = SUB1512(auVar43 << 0x20,3);
      sVar48 = auVar49._0_2_;
      sVar50 = auVar49._2_2_;
      sVar90 = (0x100 - (short)Var37) * sVar50;
      uVar91 = (0x100 - auVar29._8_2_) * sVar48;
      auVar44._2_2_ = uVar91;
      auVar44._0_2_ = sVar90;
      auVar44._4_8_ = 0;
      auVar19._12_2_ = sVar90;
      auVar19._0_12_ = auVar44 << 0x30;
      uVar74 = CONCAT44(auVar19._10_4_,CONCAT22((0x100 - auVar38._0_2_) * sVar48,sVar90));
      auVar39._6_8_ = 0;
      auVar39._0_6_ = (uint6)((ulong)uVar74 >> 0x10);
      uVar71 = auVar78._0_4_ + iVar51 + (uint)(ushort)((0x100 - ((ushort)uVar2 & 0xff)) * sVar48);
      uVar80 = auVar78._4_4_ + iVar51 +
               (int)CONCAT82(SUB148(auVar39 << 0x40,6),(0x100 - auVar30._2_2_) * sVar50);
      uVar81 = auVar78._8_4_ + iVar51 + (int)((ulong)uVar74 >> 0x10);
      uVar82 = auVar78._12_4_ + iVar51 + (auVar19._10_4_ >> 0x10);
      uVar53 = auVar62._0_4_ + iVar51 + (uint)uVar91;
      uVar64 = auVar62._4_4_ + iVar51 + (uint)(ushort)((0x100 - auVar25._10_2_) * sVar50);
      uVar68 = auVar62._8_4_ + iVar51 + (uint)(ushort)((0x100 - auVar21._12_2_) * sVar48);
      uVar69 = auVar62._12_4_ + iVar51 + (uint)(ushort)((0x100 - (auVar18._13_2_ >> 8)) * sVar50);
      sVar48 = (short)(uVar71 >> 9);
      cVar4 = (0 < sVar48) * (sVar48 < 0x100) * (char)(uVar71 >> 9) - (0xff < sVar48);
      uVar91 = (ushort)(uVar71 >> 0x19);
      sVar70 = CONCAT11((uVar91 != 0) * (uVar91 < 0x100) * (byte)(uVar71 >> 0x19) - (0xff < uVar91),
                        cVar4);
      sVar48 = (short)(uVar80 >> 9);
      cVar5 = (0 < sVar48) * (sVar48 < 0x100) * (char)(uVar80 >> 9) - (0xff < sVar48);
      uVar91 = (ushort)(uVar80 >> 0x19);
      uVar72 = CONCAT13((uVar91 != 0) * (uVar91 < 0x100) * (byte)(uVar80 >> 0x19) - (0xff < uVar91),
                        CONCAT12(cVar5,sVar70));
      sVar48 = (short)(uVar81 >> 9);
      cVar6 = (0 < sVar48) * (sVar48 < 0x100) * (char)(uVar81 >> 9) - (0xff < sVar48);
      uVar91 = (ushort)(uVar81 >> 0x19);
      uVar73 = CONCAT15((uVar91 != 0) * (uVar91 < 0x100) * (byte)(uVar81 >> 0x19) - (0xff < uVar91),
                        CONCAT14(cVar6,uVar72));
      sVar48 = (short)(uVar82 >> 9);
      cVar7 = (0 < sVar48) * (sVar48 < 0x100) * (char)(uVar82 >> 9) - (0xff < sVar48);
      uVar91 = (ushort)(uVar82 >> 0x19);
      uVar74 = CONCAT17((uVar91 != 0) * (uVar91 < 0x100) * (byte)(uVar82 >> 0x19) - (0xff < uVar91),
                        CONCAT16(cVar7,uVar73));
      sVar48 = (short)(uVar53 >> 9);
      cVar8 = (0 < sVar48) * (sVar48 < 0x100) * (char)(uVar53 >> 9) - (0xff < sVar48);
      uVar91 = (ushort)(uVar53 >> 0x19);
      auVar75._0_10_ =
           CONCAT19((uVar91 != 0) * (uVar91 < 0x100) * (byte)(uVar53 >> 0x19) - (0xff < uVar91),
                    CONCAT18(cVar8,uVar74));
      sVar48 = (short)(uVar64 >> 9);
      cVar9 = (0 < sVar48) * (sVar48 < 0x100) * (char)(uVar64 >> 9) - (0xff < sVar48);
      auVar75[10] = cVar9;
      uVar91 = (ushort)(uVar64 >> 0x19);
      auVar75[0xb] = (uVar91 != 0) * (uVar91 < 0x100) * (byte)(uVar64 >> 0x19) - (0xff < uVar91);
      sVar48 = (short)(uVar68 >> 9);
      cVar10 = (0 < sVar48) * (sVar48 < 0x100) * (char)(uVar68 >> 9) - (0xff < sVar48);
      auVar76[0xc] = cVar10;
      auVar76._0_12_ = auVar75;
      uVar91 = (ushort)(uVar68 >> 0x19);
      auVar76[0xd] = (uVar91 != 0) * (uVar91 < 0x100) * (byte)(uVar68 >> 0x19) - (0xff < uVar91);
      sVar48 = (short)(uVar69 >> 9);
      cVar11 = (0 < sVar48) * (sVar48 < 0x100) * (char)(uVar69 >> 9) - (0xff < sVar48);
      auVar79[0xe] = cVar11;
      auVar79._0_14_ = auVar76;
      uVar91 = (ushort)(uVar69 >> 0x19);
      auVar79[0xf] = (uVar91 != 0) * (uVar91 < 0x100) * (byte)(uVar69 >> 0x19) - (0xff < uVar91);
      sVar48 = (short)((uint)uVar72 >> 0x10);
      sVar50 = (short)((uint6)uVar73 >> 0x20);
      sVar90 = (short)((ulong)uVar74 >> 0x30);
      sVar12 = (short)((unkuint10)auVar75._0_10_ >> 0x40);
      sVar13 = auVar75._10_2_;
      sVar14 = auVar76._12_2_;
      sVar15 = auVar79._14_2_;
      *(ulong *)(dst + lVar45) =
           CONCAT17((0 < sVar15) * (sVar15 < 0x100) * cVar11 - (0xff < sVar15),
                    CONCAT16((0 < sVar14) * (sVar14 < 0x100) * cVar10 - (0xff < sVar14),
                             CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar9 - (0xff < sVar13),
                                      CONCAT14((0 < sVar12) * (sVar12 < 0x100) * cVar8 -
                                               (0xff < sVar12),
                                               CONCAT13((0 < sVar90) * (sVar90 < 0x100) * cVar7 -
                                                        (0xff < sVar90),
                                                        CONCAT12((0 < sVar50) * (sVar50 < 0x100) *
                                                                 cVar6 - (0xff < sVar50),
                                                                 CONCAT11((0 < sVar48) *
                                                                          (sVar48 < 0x100) * cVar5 -
                                                                          (0xff < sVar48),
                                                                          (0 < sVar70) *
                                                                          (sVar70 < 0x100) * cVar4 -
                                                                          (0xff < sVar70))))))));
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static void smooth_predictor_wxh(uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
                                 const uint8_t *LIBAOM_RESTRICT top_row,
                                 const uint8_t *LIBAOM_RESTRICT left_column,
                                 int width, int height) {
  const uint8_t *const sm_weights_h = smooth_weights + height - 4;
  const uint8_t *const sm_weights_w = smooth_weights + width - 4;
  const __m128i zero = _mm_setzero_si128();
  const __m128i scale_value = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i bottom_left = _mm_cvtsi32_si128(left_column[height - 1]);
  const __m128i top_right = _mm_set1_epi16(top_row[width - 1]);
  const __m128i round = _mm_set1_epi32(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  for (int y = 0; y < height; ++y) {
    const __m128i weights_y = _mm_cvtsi32_si128(sm_weights_h[y]);
    const __m128i left_y = _mm_cvtsi32_si128(left_column[y]);
    const __m128i scale_m_weights_y = _mm_sub_epi16(scale_value, weights_y);
    __m128i scaled_bottom_left =
        _mm_mullo_epi16(scale_m_weights_y, bottom_left);
    const __m128i weight_left_y =
        _mm_shuffle_epi32(_mm_unpacklo_epi16(weights_y, left_y), 0);
    scaled_bottom_left = _mm_add_epi32(scaled_bottom_left, round);
    scaled_bottom_left = _mm_shuffle_epi32(scaled_bottom_left, 0);
    for (int x = 0; x < width; x += 8) {
      const __m128i top_x = LoadLo8(top_row + x);
      const __m128i weights_x = LoadLo8(sm_weights_w + x);
      const __m128i top_weights_x = _mm_unpacklo_epi8(top_x, weights_x);
      const __m128i top_weights_x_lo = cvtepu8_epi16(top_weights_x);
      const __m128i top_weights_x_hi = _mm_unpackhi_epi8(top_weights_x, zero);

      // Here opposite weights and pixels are multiplied, where the order of
      // interleaving is indicated in the names.
      __m128i pred_lo = _mm_madd_epi16(top_weights_x_lo, weight_left_y);
      __m128i pred_hi = _mm_madd_epi16(top_weights_x_hi, weight_left_y);

      // |scaled_bottom_left| is always scaled by the same weight each row, so
      // we only derive |scaled_top_right| values here.
      const __m128i inverted_weights_x =
          _mm_sub_epi16(scale_value, cvtepu8_epi16(weights_x));
      const __m128i scaled_top_right =
          _mm_mullo_epi16(inverted_weights_x, top_right);
      const __m128i scaled_top_right_lo = cvtepu16_epi32(scaled_top_right);
      const __m128i scaled_top_right_hi =
          _mm_unpackhi_epi16(scaled_top_right, zero);
      pred_lo = _mm_add_epi32(pred_lo, scaled_bottom_left);
      pred_hi = _mm_add_epi32(pred_hi, scaled_bottom_left);
      pred_lo = _mm_add_epi32(pred_lo, scaled_top_right_lo);
      pred_hi = _mm_add_epi32(pred_hi, scaled_top_right_hi);

      // The round value for RightShiftWithRounding was added with
      // |scaled_bottom_left|.
      pred_lo = _mm_srli_epi32(pred_lo, (1 + SMOOTH_WEIGHT_LOG2_SCALE));
      pred_hi = _mm_srli_epi32(pred_hi, (1 + SMOOTH_WEIGHT_LOG2_SCALE));
      const __m128i pred = _mm_packus_epi16(pred_lo, pred_hi);
      StoreLo8(dst + x, _mm_packus_epi16(pred, pred));
    }
    dst += stride;
  }
}